

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts3EvalNextRow(Fts3Cursor *pCsr,Fts3Expr *pExpr,int *pRc)

{
  u8 *pbEof;
  char *pcVar1;
  u8 uVar2;
  Fts3Expr *pFVar3;
  Fts3Expr *pFVar4;
  Fts3Phrase *pFVar5;
  Fts3Table *pTab;
  int iVar6;
  long lVar7;
  char *__dest;
  ulong uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  char **ppcVar14;
  uint uVar15;
  Fts3Expr *pFVar16;
  TokenDoclist *p;
  long in_FS_OFFSET;
  bool bVar17;
  u8 uVar18;
  char *local_d8;
  char *pR;
  char *pL;
  int iStack_c0;
  u8 local_b9;
  TokenDoclist local_b8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*pRc == 0) && (pExpr->bEof == '\0')) {
    pbEof = &pExpr->bEof;
    uVar2 = pCsr->bDesc;
    pExpr->bStart = '\x01';
    switch(pExpr->eType) {
    case 1:
    case 3:
      pFVar3 = pExpr->pLeft;
      pFVar4 = pExpr->pRight;
      if (pFVar3->bDeferred == '\0') {
        uVar18 = pFVar4->bDeferred;
        fts3EvalNextRow(pCsr,pFVar3,pRc);
        if (uVar18 == '\0') {
          fts3EvalNextRow(pCsr,pFVar4,pRc);
          while (pFVar3->bEof == '\0') {
            uVar18 = pFVar4->bEof;
            if (uVar18 != '\0') {
              lVar11 = pFVar3->iDocid;
LAB_001b3efe:
              pExpr->iDocid = lVar11;
              bVar17 = uVar18 != '\0';
              goto LAB_001b3f07;
            }
            lVar11 = pFVar3->iDocid;
            if (*pRc != 0) goto LAB_001b3efe;
            iVar6 = -(uint)(lVar11 != pFVar4->iDocid);
            if (pFVar4->iDocid < lVar11) {
              iVar6 = 1;
            }
            iVar9 = -iVar6;
            if (uVar2 == '\0') {
              iVar9 = iVar6;
            }
            if (iVar9 == 0) goto LAB_001b3efe;
            pFVar16 = pFVar3;
            if (-1 < iVar9) {
              pFVar16 = pFVar4;
            }
            fts3EvalNextRow(pCsr,pFVar16,pRc);
          }
          pExpr->iDocid = pFVar3->iDocid;
          bVar17 = true;
LAB_001b3f07:
          pExpr->bEof = bVar17;
          if ((pExpr->eType == 1) && (bVar17 != false)) {
            pFVar5 = pFVar4->pPhrase;
            if ((pFVar5->doclist).aAll != (char *)0x0) {
              while ((*pRc == 0 && (pFVar4->bEof == '\0'))) {
                memset((pFVar5->doclist).pList,0,(long)(pFVar5->doclist).nList);
                fts3EvalNextRow(pCsr,pFVar4,pRc);
              }
            }
            pFVar5 = pFVar3->pPhrase;
            if ((pFVar5 != (Fts3Phrase *)0x0) && ((pFVar5->doclist).aAll != (char *)0x0)) {
              while ((*pRc == 0 && (pFVar3->bEof == '\0'))) {
                memset((pFVar5->doclist).pList,0,(long)(pFVar5->doclist).nList);
                fts3EvalNextRow(pCsr,pFVar3,pRc);
              }
            }
            pFVar3->bEof = '\x01';
            pFVar4->bEof = '\x01';
          }
        }
        else {
          pExpr->iDocid = pFVar3->iDocid;
          pExpr->bEof = pFVar3->bEof;
        }
      }
      else {
        fts3EvalNextRow(pCsr,pFVar4,pRc);
        pExpr->iDocid = pFVar4->iDocid;
        pExpr->bEof = pFVar4->bEof;
      }
      break;
    case 2:
      pFVar3 = pExpr->pLeft;
      pFVar4 = pExpr->pRight;
      if (pFVar4->bStart == '\0') {
        fts3EvalNextRow(pCsr,pFVar4,pRc);
      }
      fts3EvalNextRow(pCsr,pFVar3,pRc);
      uVar18 = pFVar3->bEof;
      if (uVar18 == '\0') {
        while ((*pRc == 0 && (pFVar4->bEof == '\0'))) {
          bVar17 = pFVar3->iDocid < pFVar4->iDocid;
          if (uVar2 == '\0') {
            bVar17 = pFVar4->iDocid < pFVar3->iDocid;
          }
          if (!bVar17) break;
          fts3EvalNextRow(pCsr,pFVar4,pRc);
        }
        uVar18 = pFVar3->bEof;
      }
      pExpr->iDocid = pFVar3->iDocid;
      pExpr->bEof = uVar18;
      break;
    case 4:
      pFVar3 = pExpr->pLeft;
      pFVar4 = pExpr->pRight;
      iVar6 = -(uint)(pFVar3->iDocid != pFVar4->iDocid);
      if (pFVar4->iDocid < pFVar3->iDocid) {
        iVar6 = 1;
      }
      uVar15 = -(uint)(uVar2 != '\0') | 1;
      pFVar16 = pFVar3;
      if (pFVar4->bEof == '\0') {
        iVar6 = iVar6 * uVar15;
        if (((pFVar3->bEof != '\0') || (-1 < iVar6)) &&
           ((pFVar16 = pFVar4, pFVar3->bEof == '\0' && (iVar6 < 1)))) {
          fts3EvalNextRow(pCsr,pFVar3,pRc);
        }
      }
      fts3EvalNextRow(pCsr,pFVar16,pRc);
      if (pFVar3->bEof == '\0') {
        bVar17 = false;
      }
      else {
        bVar17 = pFVar4->bEof != '\0';
      }
      *pbEof = bVar17;
      lVar11 = pFVar3->iDocid;
      if (pFVar4->bEof == '\0') {
        lVar13 = pFVar4->iDocid;
        iVar6 = -(uint)(lVar11 != lVar13);
        if (lVar13 < lVar11) {
          iVar6 = 1;
        }
        if ((pFVar3->bEof != '\0') || (-1 < (int)(iVar6 * uVar15))) {
          pExpr->iDocid = lVar13;
          break;
        }
      }
      pExpr->iDocid = lVar11;
      break;
    default:
      pFVar5 = pExpr->pPhrase;
      fts3EvalInvalidatePoslist(pFVar5);
      pTab = (Fts3Table *)(pCsr->base).pVtab;
      if (pFVar5->bIncr == 0) {
        if ((pCsr->bDesc == pTab->bDescIdx) || (iVar6 = (pFVar5->doclist).nAll, iVar6 == 0)) {
          fts3EvalDlPhraseNext(pTab,&pFVar5->doclist,pbEof);
        }
        else {
          sqlite3Fts3DoclistPrev
                    ((uint)pTab->bDescIdx,(pFVar5->doclist).aAll,iVar6,&(pFVar5->doclist).pNextDocid
                     ,&(pFVar5->doclist).iDocid,&(pFVar5->doclist).nList,pbEof);
          (pFVar5->doclist).pList = (pFVar5->doclist).pNextDocid;
        }
        iVar6 = 0;
      }
      else {
        local_b9 = '\0';
        if (pFVar5->nToken == 1) {
          iVar6 = sqlite3Fts3MsrIncrNext
                            (pTab,pFVar5->aToken[0].pSegcsr,&(pFVar5->doclist).iDocid,
                             &(pFVar5->doclist).pList,&(pFVar5->doclist).nList);
          uVar18 = (pFVar5->doclist).pList == (char *)0x0;
        }
        else {
          uVar2 = pCsr->bDesc;
          local_48 = 0;
          uStack_40 = 0;
          local_58 = 0;
          uStack_50 = 0;
          local_68 = 0;
          uStack_60 = 0;
          local_78 = 0;
          uStack_70 = 0;
          local_88 = 0;
          uStack_80 = 0;
          local_98 = 0;
          uStack_90 = 0;
          local_b8.pList = (char *)0x0;
          local_b8.nList = 0;
          local_b8._28_4_ = 0;
          local_b8.bIgnore = 0;
          local_b8._4_4_ = 0;
          local_b8.iDocid = 0;
          uVar18 = '\0';
          uVar15 = -(uint)(uVar2 != '\0') | 1;
          iVar6 = 0;
          while (p = &local_b8, uVar18 == '\0') {
            lVar13 = 0;
            bVar17 = false;
            lVar11 = 0;
            while (((iVar6 == 0 && (lVar13 < pFVar5->nToken)) && (local_b9 == '\0'))) {
              iVar6 = incrPhraseTokenNext(pTab,pFVar5,(int)lVar13,p,&local_b9);
              lVar7 = lVar11;
              if (p->bIgnore == 0) {
                lVar7 = p->iDocid;
                if (bVar17) {
                  iVar9 = -(uint)(lVar11 != lVar7);
                  if (lVar7 < lVar11) {
                    iVar9 = 1;
                  }
                  iVar12 = -iVar9;
                  if (uVar2 == '\0') {
                    iVar12 = iVar9;
                  }
                  if (-1 < iVar12) {
                    lVar7 = lVar11;
                  }
                  bVar17 = true;
                }
                else {
                  bVar17 = true;
                }
              }
              lVar13 = lVar13 + 1;
              p = p + 1;
              lVar11 = lVar7;
            }
            iVar9 = 0;
            while (uVar18 = local_b9, lVar13 = lVar11, iVar9 < pFVar5->nToken) {
              while (((iVar12 = iVar9, lVar11 = lVar13, iVar6 == 0 && (local_b9 == '\0')) &&
                     ((&local_b8)[iVar12].bIgnore == 0))) {
                iVar9 = 1;
                if ((&local_b8)[iVar12].iDocid <= lVar11) {
                  iVar9 = -(uint)((&local_b8)[iVar12].iDocid != lVar11);
                }
                if (-1 < (int)(iVar9 * uVar15)) break;
                iVar6 = incrPhraseTokenNext(pTab,pFVar5,iVar12,&local_b8 + iVar12,&local_b9);
                lVar13 = (&local_b8)[iVar12].iDocid;
                iVar10 = 1;
                if (lVar13 <= lVar11) {
                  iVar10 = -(uint)(lVar13 != lVar11);
                }
                iVar9 = 0;
                if ((int)(iVar10 * uVar15) < 1) {
                  lVar13 = lVar11;
                  iVar9 = iVar12;
                }
              }
              iVar9 = iVar12 + 1;
            }
            if (local_b9 == '\0') {
              iVar9 = (&iStack_c0)[(long)pFVar5->nToken * 8];
              __dest = (char *)sqlite3_malloc64((long)iVar9 + 8);
              if (__dest == (char *)0x0) {
                iVar6 = 7;
                goto LAB_001b3fdd;
              }
              memcpy(__dest,(&pL)[(long)pFVar5->nToken * 4],(long)(iVar9 + 1));
              pcVar1 = __dest + iVar9;
              pcVar1[0] = '\0';
              pcVar1[1] = '\0';
              pcVar1[2] = '\0';
              pcVar1[3] = '\0';
              pcVar1[4] = '\0';
              pcVar1[5] = '\0';
              pcVar1[6] = '\0';
              pcVar1[7] = '\0';
              lVar13 = 0;
              iVar9 = -1;
              ppcVar14 = &local_b8.pList;
              iVar12 = 0;
              while( true ) {
                uVar8 = (long)pFVar5->nToken - 1;
                if ((long)uVar8 <= lVar13) break;
                if (((TokenDoclist *)(ppcVar14 + -2))->bIgnore == 0) {
                  pL = *ppcVar14;
                  local_d8 = __dest;
                  pR = __dest;
                  iVar10 = fts3PoslistPhraseMerge(&local_d8,pFVar5->nToken + iVar9,0,1,&pL,&pR);
                  if (iVar10 == 0) {
                    uVar8 = (ulong)(pFVar5->nToken - 1);
                    break;
                  }
                  iVar12 = (int)local_d8 - (int)__dest;
                }
                lVar13 = lVar13 + 1;
                ppcVar14 = ppcVar14 + 4;
                iVar9 = iVar9 + -1;
              }
              if ((int)uVar8 == (int)lVar13) {
                (pFVar5->doclist).iDocid = lVar11;
                (pFVar5->doclist).pList = __dest;
                (pFVar5->doclist).nList = iVar12;
                (pFVar5->doclist).bFreeList = 1;
                uVar18 = '\0';
                break;
              }
              sqlite3_free(__dest);
            }
          }
        }
        *pbEof = uVar18;
      }
LAB_001b3fdd:
      *pRc = iVar6;
      pExpr->iDocid = (pFVar5->doclist).iDocid;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void fts3EvalNextRow(
  Fts3Cursor *pCsr,               /* FTS Cursor handle */
  Fts3Expr *pExpr,                /* Expr. to advance to next matching row */
  int *pRc                        /* IN/OUT: Error code */
){
  if( *pRc==SQLITE_OK && pExpr->bEof==0 ){
    int bDescDoclist = pCsr->bDesc;         /* Used by DOCID_CMP() macro */
    pExpr->bStart = 1;

    switch( pExpr->eType ){
      case FTSQUERY_NEAR:
      case FTSQUERY_AND: {
        Fts3Expr *pLeft = pExpr->pLeft;
        Fts3Expr *pRight = pExpr->pRight;
        assert( !pLeft->bDeferred || !pRight->bDeferred );

        if( pLeft->bDeferred ){
          /* LHS is entirely deferred. So we assume it matches every row.
          ** Advance the RHS iterator to find the next row visited. */
          fts3EvalNextRow(pCsr, pRight, pRc);
          pExpr->iDocid = pRight->iDocid;
          pExpr->bEof = pRight->bEof;
        }else if( pRight->bDeferred ){
          /* RHS is entirely deferred. So we assume it matches every row.
          ** Advance the LHS iterator to find the next row visited. */
          fts3EvalNextRow(pCsr, pLeft, pRc);
          pExpr->iDocid = pLeft->iDocid;
          pExpr->bEof = pLeft->bEof;
        }else{
          /* Neither the RHS or LHS are deferred. */
          fts3EvalNextRow(pCsr, pLeft, pRc);
          fts3EvalNextRow(pCsr, pRight, pRc);
          while( !pLeft->bEof && !pRight->bEof && *pRc==SQLITE_OK ){
            sqlite3_int64 iDiff = DOCID_CMP(pLeft->iDocid, pRight->iDocid);
            if( iDiff==0 ) break;
            if( iDiff<0 ){
              fts3EvalNextRow(pCsr, pLeft, pRc);
            }else{
              fts3EvalNextRow(pCsr, pRight, pRc);
            }
          }
          pExpr->iDocid = pLeft->iDocid;
          pExpr->bEof = (pLeft->bEof || pRight->bEof);
          if( pExpr->eType==FTSQUERY_NEAR && pExpr->bEof ){
            assert( pRight->eType==FTSQUERY_PHRASE );
            if( pRight->pPhrase->doclist.aAll ){
              Fts3Doclist *pDl = &pRight->pPhrase->doclist;
              while( *pRc==SQLITE_OK && pRight->bEof==0 ){
                memset(pDl->pList, 0, pDl->nList);
                fts3EvalNextRow(pCsr, pRight, pRc);
              }
            }
            if( pLeft->pPhrase && pLeft->pPhrase->doclist.aAll ){
              Fts3Doclist *pDl = &pLeft->pPhrase->doclist;
              while( *pRc==SQLITE_OK && pLeft->bEof==0 ){
                memset(pDl->pList, 0, pDl->nList);
                fts3EvalNextRow(pCsr, pLeft, pRc);
              }
            }
            pRight->bEof = pLeft->bEof = 1;
          }
        }
        break;
      }

      case FTSQUERY_OR: {
        Fts3Expr *pLeft = pExpr->pLeft;
        Fts3Expr *pRight = pExpr->pRight;
        sqlite3_int64 iCmp = DOCID_CMP(pLeft->iDocid, pRight->iDocid);

        assert_fts3_nc( pLeft->bStart || pLeft->iDocid==pRight->iDocid );
        assert_fts3_nc( pRight->bStart || pLeft->iDocid==pRight->iDocid );

        if( pRight->bEof || (pLeft->bEof==0 && iCmp<0) ){
          fts3EvalNextRow(pCsr, pLeft, pRc);
        }else if( pLeft->bEof || iCmp>0 ){
          fts3EvalNextRow(pCsr, pRight, pRc);
        }else{
          fts3EvalNextRow(pCsr, pLeft, pRc);
          fts3EvalNextRow(pCsr, pRight, pRc);
        }

        pExpr->bEof = (pLeft->bEof && pRight->bEof);
        iCmp = DOCID_CMP(pLeft->iDocid, pRight->iDocid);
        if( pRight->bEof || (pLeft->bEof==0 &&  iCmp<0) ){
          pExpr->iDocid = pLeft->iDocid;
        }else{
          pExpr->iDocid = pRight->iDocid;
        }

        break;
      }

      case FTSQUERY_NOT: {
        Fts3Expr *pLeft = pExpr->pLeft;
        Fts3Expr *pRight = pExpr->pRight;

        if( pRight->bStart==0 ){
          fts3EvalNextRow(pCsr, pRight, pRc);
          assert( *pRc!=SQLITE_OK || pRight->bStart );
        }

        fts3EvalNextRow(pCsr, pLeft, pRc);
        if( pLeft->bEof==0 ){
          while( !*pRc
              && !pRight->bEof
              && DOCID_CMP(pLeft->iDocid, pRight->iDocid)>0
          ){
            fts3EvalNextRow(pCsr, pRight, pRc);
          }
        }
        pExpr->iDocid = pLeft->iDocid;
        pExpr->bEof = pLeft->bEof;
        break;
      }

      default: {
        Fts3Phrase *pPhrase = pExpr->pPhrase;
        fts3EvalInvalidatePoslist(pPhrase);
        *pRc = fts3EvalPhraseNext(pCsr, pPhrase, &pExpr->bEof);
        pExpr->iDocid = pPhrase->doclist.iDocid;
        break;
      }
    }
  }
}